

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_ptr.hpp
# Opt level: O2

qsbr_ptr<const_std::byte> * __thiscall
unodb::qsbr_ptr<const_std::byte>::operator++(qsbr_ptr<const_std::byte> *this)

{
  pointer pbVar1;
  
  detail::qsbr_ptr_base::unregister_active_ptr(this->ptr);
  pbVar1 = this->ptr;
  this->ptr = pbVar1 + 1;
  detail::qsbr_ptr_base::register_active_ptr(pbVar1 + 1);
  return this;
}

Assistant:

constexpr qsbr_ptr &operator++() noexcept {
#ifndef NDEBUG
    unregister_active_ptr(ptr);
#endif
    ++ptr;
#ifndef NDEBUG
    register_active_ptr(ptr);
#endif
    return *this;
  }